

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O0

size_t Col_RopeFind(Col_Word rope,Col_Char c,size_t start,size_t max,int reverse)

{
  size_t sVar1;
  Col_Char local_40;
  int local_3c;
  FindCharInfo info;
  int reverse_local;
  size_t max_local;
  size_t start_local;
  Col_Char c_local;
  Col_Word rope_local;
  
  info.c = 0xffffffff;
  info.reverse = -1;
  local_40 = c;
  local_3c = reverse;
  info.pos._4_4_ = reverse;
  Col_TraverseRopeChunks(rope,start,max,reverse,FindCharProc,&local_40,(size_t *)0x0);
  sVar1._0_4_ = info.c;
  sVar1._4_4_ = info.reverse;
  return sVar1;
}

Assistant:

size_t
Col_RopeFind(
    Col_Word rope,      /*!< Rope to search character into. */
    Col_Char c,         /*!< Character to search for. */
    size_t start,       /*!< Starting index. */
    size_t max,         /*!< Maximum number of characters to search. */
    int reverse)        /*!< Whether to traverse in reverse order. */
{
    FindCharInfo info;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_ROPE,rope} */
    TYPECHECK_ROPE(rope) return SIZE_MAX;

    info.c = c;
    info.reverse = reverse;
    info.pos = SIZE_MAX;
    Col_TraverseRopeChunks(rope, start, max, reverse, FindCharProc, &info,
            NULL);

    return info.pos;
}